

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

Path * __thiscall tinyusdz::Path::get_parent_path(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  string *p_00;
  allocator local_131;
  string local_130;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  long local_a0;
  size_t n;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_41;
  string local_40;
  undefined1 local_19;
  Path *local_18;
  Path *this_local;
  Path *p;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  if ((this->_valid & 1U) == 0) {
    Path(__return_storage_ptr__);
  }
  else {
    bVar1 = is_root_path(this);
    if (bVar1) {
      local_19 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_40,"",&local_41);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_68,"",&local_69);
      Path(__return_storage_ptr__,&local_40,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
      ::std::__cxx11::string::~string((string *)&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    else {
      bVar1 = is_prim_property_path(this);
      if (bVar1) {
        p_00 = prim_part_abi_cxx11_(this);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_90,"",(allocator *)((long)&n + 7));
        Path(__return_storage_ptr__,p_00,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&n + 7));
      }
      else {
        local_a0 = ::std::__cxx11::string::find_last_of((char)this,0x2f);
        if (local_a0 == -1) {
          Path(__return_storage_ptr__);
        }
        else if (local_a0 == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_c0,"/",&local_c1);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_e8,"",&local_e9);
          Path(__return_storage_ptr__,&local_c0,&local_e8);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          ::std::__cxx11::string::~string((string *)&local_c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_110,(ulong)this);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_130,"",&local_131);
          Path(__return_storage_ptr__,&local_110,&local_130);
          ::std::__cxx11::string::~string((string *)&local_130);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
          ::std::__cxx11::string::~string((string *)&local_110);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::get_parent_path() const {
  if (!_valid) {
    return Path();
  }

  if (is_root_path()) {
    Path p("", "");
    return p;
  }

  if (is_prim_property_path()) {
    // return prim part
    return Path(prim_part(), "");
  }

  size_t n = _prim_part.find_last_of('/');
  if (n == std::string::npos) {
    // relative path(e.g. "bora") or propery only path(e.g. ".myval").
    return Path();
  }

  if (n == 0) {
    // return root
    return Path("/", "");
  }

  return Path(_prim_part.substr(0, n), "");
}